

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTDMT_waitForAllJobsCompleted(ZSTDMT_CCtx *mtctx)

{
  uint uVar1;
  long in_RDI;
  uint jobID;
  
  while (*(uint *)(in_RDI + 0xbb4) < *(uint *)(in_RDI + 3000)) {
    uVar1 = *(uint *)(in_RDI + 0xbb4) & *(uint *)(in_RDI + 0xbb0);
    pthread_mutex_lock((pthread_mutex_t *)(*(long *)(in_RDI + 8) + (ulong)uVar1 * 0x1b8 + 0x10));
    while (*(ulong *)(*(long *)(in_RDI + 8) + (ulong)uVar1 * 0x1b8) <
           *(ulong *)(*(long *)(in_RDI + 8) + (ulong)uVar1 * 0x1b8 + 0xb0)) {
      pthread_cond_wait((pthread_cond_t *)(*(long *)(in_RDI + 8) + (ulong)uVar1 * 0x1b8 + 0x38),
                        (pthread_mutex_t *)(*(long *)(in_RDI + 8) + (ulong)uVar1 * 0x1b8 + 0x10));
    }
    pthread_mutex_unlock((pthread_mutex_t *)(*(long *)(in_RDI + 8) + (ulong)uVar1 * 0x1b8 + 0x10));
    *(int *)(in_RDI + 0xbb4) = *(int *)(in_RDI + 0xbb4) + 1;
  }
  return;
}

Assistant:

static void ZSTDMT_waitForAllJobsCompleted(ZSTDMT_CCtx* mtctx)
{
    DEBUGLOG(4, "ZSTDMT_waitForAllJobsCompleted");
    while (mtctx->doneJobID < mtctx->nextJobID) {
        unsigned const jobID = mtctx->doneJobID & mtctx->jobIDMask;
        ZSTD_PTHREAD_MUTEX_LOCK(&mtctx->jobs[jobID].job_mutex);
        while (mtctx->jobs[jobID].consumed < mtctx->jobs[jobID].src.size) {
            DEBUGLOG(4, "waiting for jobCompleted signal from job %u", mtctx->doneJobID);   /* we want to block when waiting for data to flush */
            ZSTD_pthread_cond_wait(&mtctx->jobs[jobID].job_cond, &mtctx->jobs[jobID].job_mutex);
        }
        ZSTD_pthread_mutex_unlock(&mtctx->jobs[jobID].job_mutex);
        mtctx->doneJobID++;
    }
}